

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void print_range_(Integer *me,Integer *LO,Integer *HI,Integer *ndim)

{
  int n;
  int lo [7];
  int hi [7];
  char msg [100];
  int aiStack_d8 [8];
  int local_b8 [8];
  char local_98 [112];
  
  if ((int)*ndim < 8) {
    sprintf(local_98,"%d: array section ",(ulong)(uint)*me);
    n = (int)*ndim;
    f2c_copy_indices(HI,local_b8,n);
    f2c_copy_indices(LO,aiStack_d8,n);
    print_range_internal(local_98,n,aiStack_d8,local_b8,"\n");
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x16d,"void print_range_(Integer *, Integer *, Integer *, Integer *)");
}

Assistant:

void FATR print_range_(Integer *me, Integer LO[], Integer HI[], Integer *ndim)
{
int hi[GA_MAX_DIM], lo[GA_MAX_DIM];
char msg[100];

    /* GA_MAX_DIM is defined for C and Fortran. Fortran routines should use <=
     * whereas C routines should use < for comparisons. */
    assert((int)*ndim <= GA_MAX_DIM);
    sprintf(msg,"%d: array section ",(int)*me);
    f2c_copy_indices(HI, hi, (int)*ndim);
    f2c_copy_indices(LO, lo, (int)*ndim);
    print_range_internal(msg,(int)*ndim, lo, hi, "\n");
}